

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O0

void __thiscall Outputs::Display::BufferingScanTarget::will_change_owner(BufferingScanTarget *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock_guard;
  BufferingScanTarget *this_local;
  
  lock_guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->producer_mutex_);
  this->allocation_has_failed_ = true;
  this->vended_scan_ = (Scan *)0x0;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void BufferingScanTarget::will_change_owner() {
	std::lock_guard lock_guard(producer_mutex_);
	allocation_has_failed_ = true;
	vended_scan_ = nullptr;
#ifdef DEBUG
	data_is_allocated_ = false;
#endif
}